

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

bool RigidBodyDynamics::Math::SpatialVectorCompareEpsilon
               (SpatialVector *vector_a,SpatialVector *vector_b,double epsilon)

{
  CoeffReturnType pdVar1;
  ostream *poVar2;
  double in_XMM0_Qa;
  uint i;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_00000218;
  ostream *in_stack_00000220;
  Index in_stack_ffffffffffffffc8;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *in_stack_ffffffffffffffd0;
  uint local_24;
  
  local_24 = 0;
  while( true ) {
    if (5 < local_24) {
      return true;
    }
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)*pdVar1;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (in_XMM0_Qa <= ABS((double)in_stack_ffffffffffffffd0 - *pdVar1)) break;
    local_24 = local_24 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Expected:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(in_stack_00000220,in_stack_00000218);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"but was");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = Eigen::operator<<(in_stack_00000220,in_stack_00000218);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

RBDL_DLLAPI
bool SpatialVectorCompareEpsilon (const SpatialVector &vector_a, const SpatialVector &vector_b, double epsilon) {
	assert (epsilon >= 0.);
	unsigned int i;

	for (i = 0; i < 6; i++) {
		if (fabs(vector_a[i] - vector_b[i]) >= epsilon) {
			std::cerr << "Expected:" 
				<< std::endl << vector_a << std::endl
				<< "but was" << std::endl 
				<< vector_b << std::endl;
			return false;
		}
	}

	return true;
}